

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblemenu.cpp
# Opt level: O0

QAccessibleInterface * __thiscall QAccessibleMenuBar::child(QAccessibleMenuBar *this,int index)

{
  long lVar1;
  int iVar2;
  QWidget *this_00;
  int in_ESI;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  qsizetype in_stack_ffffffffffffffa8;
  QList<QAction_*> *in_stack_ffffffffffffffb0;
  undefined8 local_28;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = (**(code **)(*(long *)in_RDI + 0x50))();
  if (in_ESI < iVar2) {
    this_00 = &menuBar((QAccessibleMenuBar *)0x7db22b)->super_QWidget;
    menuBar((QAccessibleMenuBar *)0x7db23a);
    QWidget::actions(this_00);
    QList<QAction_*>::at(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    local_28 = getOrCreateMenu(in_RDI,(QAction *)this_00);
    QList<QAction_*>::~QList((QList<QAction_*> *)0x7db272);
  }
  else {
    local_28 = (QAccessibleInterface *)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_28;
  }
  __stack_chk_fail();
}

Assistant:

QAccessibleInterface *QAccessibleMenuBar::child(int index) const
{
    if (index < childCount()) {
        return getOrCreateMenu(menuBar(), menuBar()->actions().at(index));
    }
    return nullptr;
}